

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_bea9::ktxTexture2_LoadImageDataTest_LoadImageDataExternal_Test::TestBody
          (ktxTexture2_LoadImageDataTest_LoadImageDataExternal_Test *this)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  undefined4 uVar4;
  ktx_uint8_t *pkVar5;
  size_t sVar6;
  char *pcVar7;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktxTexture *texture;
  ktx_error_code_e result;
  AssertHelper local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  AssertHelper local_30;
  ktx_error_code_e local_24;
  
  local_38 = 0;
  pkVar5 = (this->super_ktxTexture2_LoadImageDataTest).
           super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
           super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.ktxMemFile;
  if (pkVar5 != (ktx_uint8_t *)0x0) {
    local_24 = ktxTexture_CreateFromMemory
                         (pkVar5,(this->super_ktxTexture2_LoadImageDataTest).
                                 super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
                                 super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.ktxMemFileLen,0
                          ,&local_38);
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_68._M_head_impl._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
              ((internal *)local_58,"result","KTX_SUCCESS",&local_24,(ktx_error_code_e *)&local_68);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (local_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0x470,pcVar7);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    local_68._M_head_impl._0_1_ = local_38 != 0;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_38 == 0) {
      testing::Message::Message((Message *)&local_70);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) + 0x10),
                 "ktxTexture_CreateFromMemory failed: ",0x24);
      pcVar7 = (char *)ktxErrorString(local_24);
      lVar2 = CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_);
      if (pcVar7 == (char *)0x0) {
        sVar6 = 6;
        pcVar7 = "(null)";
      }
      else {
        sVar6 = strlen(pcVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar2 + 0x10),pcVar7,sVar6);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_58,(internal *)&local_68,(AssertionResult *)0x17896e,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0x471,(char *)CONCAT71(local_58._1_7_,local_58[0]));
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_58._1_7_,local_58[0]),local_48._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) + 8))();
      }
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_60,local_60);
      }
    }
    else {
      uVar1 = (this->super_ktxTexture2_LoadImageDataTest).
              super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
              super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.paddedImageDataSize;
      pkVar5 = (ktx_uint8_t *)operator_new__(uVar1);
      uVar4 = (**(code **)(*(long *)(local_38 + 8) + 0x40))(local_38,pkVar5,uVar1);
      local_68._M_head_impl._0_4_ = uVar4;
      local_70.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
                ((internal *)local_58,
                 "(texture)->vtbl->LoadImageData(texture, buf, paddedImageDataSize)","KTX_SUCCESS",
                 (ktx_error_code_e *)&local_68,(ktx_error_code_e *)&local_70);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (local_50->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x475,pcVar7);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      local_68._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ktxTexture_GetDataSize(local_38);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_58,"paddedImageDataSize","ktxTexture_GetDataSize(texture)",
                 &(this->super_ktxTexture2_LoadImageDataTest).
                  super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
                  super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.paddedImageDataSize,
                 (unsigned_long *)&local_68);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (local_50->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x476,pcVar7);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      bVar3 = TextureWriterTestHelper<unsigned_char,_4U,_32856U>::compareTexture2Images
                        (&(this->super_ktxTexture2_LoadImageDataTest).
                          super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
                          super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.helper,pkVar5);
      local_68._M_head_impl._0_1_ = bVar3;
      local_70.data_._0_4_ = CONCAT31(local_70.data_._1_3_,1);
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)local_58,"helper.compareTexture2Images(buf)","true",(bool *)&local_68,
                 (bool *)&local_70);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (local_50->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x477,pcVar7);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      if (local_38 != 0) {
        (*(code *)**(undefined8 **)(local_38 + 8))();
      }
      operator_delete__(pkVar5);
    }
  }
  return;
}

Assistant:

TEST_F(ktxTexture2_LoadImageDataTest, LoadImageDataExternal) {
    ktxTexture* texture = 0;
    KTX_error_code result;
    ktx_uint8_t* buf;

    if (ktxMemFile != NULL) {
        result = ktxTexture_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                             0,
                                             &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        buf = new ktx_uint8_t[paddedImageDataSize];
        EXPECT_EQ(ktxTexture_LoadImageData(texture, buf, paddedImageDataSize),
                  KTX_SUCCESS);
        EXPECT_EQ(paddedImageDataSize, ktxTexture_GetDataSize(texture));
        EXPECT_EQ(helper.compareTexture2Images(buf), true);
        if (texture)
            ktxTexture_Destroy(texture);
        delete[] buf;
    }
}